

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O2

bool ReadHFE(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  element_type *peVar1;
  char extraout_AL;
  bool bVar2;
  uint cyl;
  ssize_t sVar3;
  uint8_t *pb;
  mapped_type *pmVar4;
  exception *peVar5;
  size_t in_RCX;
  ulong __nbytes;
  size_t __n;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  DataRate local_53c;
  unsigned_short data_bitrate;
  allocator<char> local_531;
  shared_ptr<Disk> *local_530;
  uint local_524;
  key_type local_520;
  HFE_HEADER hh;
  int track_lut_offset;
  int uTrackDataLen;
  MEMORY mem;
  BitBuffer bitbuf;
  HFE_TRACK aTrackLUT [256];
  
  local_530 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar3 = MemFile::read(file,(int)&hh,(void *)0x1a,in_RCX), (char)sVar3 == '\0')) ||
     (hh.header_signature != (char  [8])0x4546434950435848)) {
    return false;
  }
  if (hh.format_revision == '\0') {
    track_lut_offset = (uint)hh.track_list_offset << 9;
    bVar2 = MemFile::seek(file,track_lut_offset);
    if ((bVar2) &&
       (sVar3 = MemFile::read(file,(int)aTrackLUT,(void *)0x400,in_RCX), (char)sVar3 != '\0')) {
      data_bitrate = hh.bitrate_kbps;
      local_53c = _250K;
      if ((((ushort)(hh.bitrate_kbps - 0xf0) < 0x15) ||
          (local_53c = _300K, (ushort)(hh.bitrate_kbps - 0x122) < 0x15)) ||
         (local_53c = _500K, (ushort)(hh.bitrate_kbps - 0x1ea) < 0x15)) {
        bVar6 = 0;
        Format::Validate((uint)hh.number_of_tracks,(uint)hh.number_of_sides,1,0x200,0);
        mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
        mem.size = 0x10000;
        pb = AllocMem(0x10000);
        mem.pb = pb;
        do {
          if (hh.number_of_tracks <= bVar6) {
            to_string_abi_cxx11_((string *)&bitbuf,(uint)hh.floppy_interface_mode);
            peVar1 = (local_530->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_520,"interface_mode",(allocator<char> *)&uTrackDataLen);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&peVar1->metadata,&local_520);
            std::__cxx11::string::operator=((string *)pmVar4,(string *)&bitbuf);
            std::__cxx11::string::~string((string *)&local_520);
            std::__cxx11::string::~string((string *)&bitbuf);
            to_string_abi_cxx11_((string *)&bitbuf,(uint)hh.track_encoding);
            peVar1 = (local_530->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_520,"track_encoding",(allocator<char> *)&uTrackDataLen);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&peVar1->metadata,&local_520);
            std::__cxx11::string::operator=((string *)pmVar4,(string *)&bitbuf);
            std::__cxx11::string::~string((string *)&local_520);
            std::__cxx11::string::~string((string *)&bitbuf);
            std::__cxx11::to_string(&local_520,(uint)hh.bitrate_kbps);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &bitbuf,&local_520,"Kbps");
            peVar1 = (local_530->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&uTrackDataLen,"data_bitrate",&local_531);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&peVar1->metadata,(key_type *)&uTrackDataLen);
            std::__cxx11::string::operator=((string *)pmVar4,(string *)&bitbuf);
            std::__cxx11::string::~string((string *)&uTrackDataLen);
            std::__cxx11::string::~string((string *)&bitbuf);
            std::__cxx11::string::~string((string *)&local_520);
            if (hh.floppy_rpm != 0) {
              std::__cxx11::to_string((string *)&bitbuf,(uint)hh.floppy_rpm);
              peVar1 = (local_530->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_520,"floppy_rpm",(allocator<char> *)&uTrackDataLen);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&peVar1->metadata,&local_520);
              std::__cxx11::string::operator=((string *)pmVar4,(string *)&bitbuf);
              std::__cxx11::string::~string((string *)&local_520);
              std::__cxx11::string::~string((string *)&bitbuf);
            }
            std::__cxx11::string::assign
                      ((char *)&((local_530->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->strType);
            MEMORY::~MEMORY(&mem);
            return true;
          }
          cyl = (uint)bVar6;
          uVar9 = (uint)(aTrackLUT[bVar6].track_len >> 1);
          uTrackDataLen = uVar9;
          if (mem.size < (int)uVar9) {
            peVar5 = (exception *)__cxa_allocate_exception(0x10);
            bitbuf._0_8_ = CylStr(cyl);
            util::exception::exception<char_const(&)[21],int&,char_const(&)[13],char_const*>
                      (peVar5,(char (*) [21])"invalid track size (",&uTrackDataLen,
                       (char (*) [13])") for track ",(char **)&bitbuf);
            __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar7 = (uint)aTrackLUT[bVar6].offset << 9;
          for (uVar10 = 0; __nbytes = (ulong)hh.number_of_sides, uVar10 < hh.number_of_sides;
              uVar10 = uVar10 + 1) {
            iVar8 = iVar7 + 0x100;
            if (uVar10 != 1) {
              iVar8 = iVar7;
            }
            iVar7 = 0;
            local_524 = uVar10;
            while (uVar10 = uVar9 - iVar7, uVar10 != 0 && iVar7 <= (int)uVar9) {
              if (0xff < (int)uVar10) {
                uVar10 = 0x100;
              }
              bVar2 = MemFile::seek(file,iVar8 + iVar7 * 2);
              if (!bVar2) goto LAB_00191e67;
              sVar3 = MemFile::read(file,iVar7 + (int)pb,(void *)(ulong)uVar10,__nbytes);
              iVar7 = uVar10 + iVar7;
              if ((char)sVar3 == '\0') {
LAB_00191e67:
                peVar5 = (exception *)__cxa_allocate_exception(0x10);
                bitbuf._0_8_ = CH(cyl,local_524);
                util::exception::exception<char_const(&)[28],char_const*>
                          (peVar5,(char (*) [28])"EOF reading track data for ",(char **)&bitbuf);
                __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
              }
            }
            __n = (size_t)(uVar9 * 8);
            BitBuffer::BitBuffer(&bitbuf,local_53c,pb,uVar9 * 8);
            uVar10 = local_524;
            this = (local_530->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            CylHead::CylHead((CylHead *)&local_520,cyl,local_524);
            Disk::write(this,(int)&local_520,&bitbuf,__n);
            BitBuffer::~BitBuffer(&bitbuf);
            iVar7 = iVar8;
          }
          bVar6 = bVar6 + 1;
        } while( true );
      }
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      if (hh.bitrate_kbps == 0xffff) {
        util::exception::exception<char_const(&)[42]>
                  (peVar5,(char (*) [42])"variable bitrate images are not supported");
      }
      else {
        util::exception::exception<char_const(&)[24],unsigned_short&,char_const(&)[6]>
                  (peVar5,(char (*) [24])"unsupported data rate (",&data_bitrate,
                   (char (*) [6])"Kbps)");
      }
    }
    else {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],int&,char_const(&)[2]>
                (peVar5,(char (*) [28])"failed to read track LUT (@",&track_lut_offset,
                 (char (*) [2])0x1a9e10);
    }
  }
  else {
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[34],unsigned_char&,char_const(&)[2]>
              (peVar5,(char (*) [34])"unsupported HFE format revision (",&hh.format_revision,
               (char (*) [2])0x1a9e10);
  }
  __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadHFE(MemFile& file, std::shared_ptr<Disk>& disk)
{
    HFE_HEADER hh;
    if (!file.rewind() || !file.read(&hh, sizeof(hh)) || memcmp(&hh.header_signature, HFE_SIGNATURE, sizeof(hh.header_signature)))
        return false;

    if (hh.format_revision != 0)
        throw util::exception("unsupported HFE format revision (", hh.format_revision, ")");

    HFE_TRACK aTrackLUT[256];
    auto track_lut_offset = util::letoh(hh.track_list_offset) << 9;
    if (!file.seek(track_lut_offset) || !file.read(aTrackLUT, sizeof(aTrackLUT)))
        throw util::exception("failed to read track LUT (@", track_lut_offset, ")");

    auto datarate = DataRate::Unknown;
    auto data_bitrate = util::letoh(hh.bitrate_kbps);
    if (data_bitrate >= 240 && data_bitrate <= 260)
        datarate = DataRate::_250K;
    else if (data_bitrate >= 290 && data_bitrate <= 310)
        datarate = DataRate::_300K;
    else if (data_bitrate >= 490 && data_bitrate <= 510)
        datarate = DataRate::_500K;
    else if (data_bitrate == 0xffff)
        throw util::exception("variable bitrate images are not supported");
    else
        throw util::exception("unsupported data rate (", data_bitrate, "Kbps)");

    Format::Validate(hh.number_of_tracks, hh.number_of_sides);

    // 64K should be enough for maximum MFM track size, and we'll check later anyway
    MEMORY mem(0x10000);
    auto pbTrack = mem.pb;

    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        // Offset is in 512-byte blocks, data length covers both heads
        auto uTrackDataOffset = util::letoh(aTrackLUT[cyl].offset) << 9;
        auto uTrackDataLen = util::letoh(aTrackLUT[cyl].track_len) >> 1;

        if (uTrackDataLen > mem.size)
            throw util::exception("invalid track size (", uTrackDataLen, ") for track ", CylStr(cyl));

        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            // Head 1 data starts 256 bytes in
            if (head == 1)
                uTrackDataOffset += 256;

            auto uRead = 0;
            while (uRead < uTrackDataLen)
            {
                auto chunk = std::min(uTrackDataLen - uRead, 256);

                // Read the next interleaved chunk
                if (!file.seek(uTrackDataOffset + (uRead * 2)) || !file.read(pbTrack + uRead, chunk))
                    throw util::exception("EOF reading track data for ", CH(cyl, head));

                uRead += chunk;
            }

            BitBuffer bitbuf(datarate, pbTrack, uTrackDataLen * 8);
            disk->write(CylHead(cyl, head), std::move(bitbuf));
        }
    }

    disk->metadata["interface_mode"] = to_string(static_cast<FloppyInterfaceMode>(hh.floppy_interface_mode));
    disk->metadata["track_encoding"] = to_string(static_cast<TrackEncoding>(hh.track_encoding));
    disk->metadata["data_bitrate"] = std::to_string(hh.bitrate_kbps) + "Kbps";
    if (hh.floppy_rpm)
        disk->metadata["floppy_rpm"] = std::to_string(hh.floppy_rpm);

    disk->strType = "HFE";
    return true;
}